

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RtAudio.cpp
# Opt level: O2

RtAudioErrorType __thiscall RtApi::error(RtApi *this,RtAudioErrorType type)

{
  ostream *poVar1;
  allocator local_39;
  string local_38 [32];
  
  std::__cxx11::string::string(local_38,"",&local_39);
  std::__cxx11::stringbuf::str((string *)&this->field_0x10);
  std::__cxx11::string::~string(local_38);
  if ((type != RTAUDIO_WARNING) || (this->showWarnings_ != false)) {
    if ((this->errorCallback_).super__Function_base._M_manager == (_Manager_type)0x0) {
      poVar1 = std::operator<<((ostream *)&std::cerr,'\n');
      poVar1 = std::operator<<(poVar1,(string *)&this->errorText_);
      std::operator<<(poVar1,"\n\n");
    }
    else {
      std::
      function<void_(RtAudioErrorType,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
      ::operator()(&this->errorCallback_,type,&this->errorText_);
    }
  }
  return type;
}

Assistant:

RtAudioErrorType RtApi :: error( RtAudioErrorType type )
{
  errorStream_.str(""); // clear the ostringstream to avoid repeated messages

  // Don't output warnings if showWarnings_ is false
  if ( type == RTAUDIO_WARNING && showWarnings_ == false ) return type;
  
  if ( errorCallback_ ) {
    //const std::string errorMessage = errorText_;
    //errorCallback_( type, errorMessage );
    errorCallback_( type, errorText_ );
  }
  else
    std::cerr << '\n' << errorText_ << "\n\n";
  return type;
}